

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

string * ovf::detail::write::top_header_string_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_49 [9];
  string padding;
  allocator local_12;
  byte local_11;
  string *ret;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"# OOMMF OVF 2.0\n",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)empty_line_abi_cxx11_);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),6,'0',(allocator *)args);
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  fmt::v5::format<char[21],std::__cxx11::string>
            (&local_70,(v5 *)"# Segment count: {}\n",(char (*) [21])(local_49 + 1),args);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_11 = 1;
  std::__cxx11::string::~string((string *)(local_49 + 1));
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

inline std::string top_header_string()
    {
        std::string ret = "# OOMMF OVF 2.0\n";
        ret += empty_line;

        // create padding string
        std::string padding( n_segments_str_digits, '0' );
        // write padding plus n_segments
        ret += fmt::format( "# Segment count: {}\n", padding );

        return ret;
    }